

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_list.cpp
# Opt level: O2

double __thiscall ExprEval::Engine::NodeList::calc(NodeList *this,size_t index,size_t direction)

{
  pointer pNVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  CustomOperator *pCVar5;
  CustomOperator *pCVar6;
  undefined4 extraout_var;
  size_t sVar7;
  undefined4 extraout_var_00;
  Exception *pEVar8;
  ulong uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_vec;
  vector<int,_std::allocator<int>_> positions;
  string local_310 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  Node node;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  ostringstream tmp;
  double args [10];
  
  pNVar1 = (this->m_nodes).
           super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->m_nodes).
                super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pNVar1;
  if ((ulong)(lVar4 / 0x50) <= index) {
    pEVar8 = (Exception *)__cxa_allocate_exception(0x30,pNVar1,lVar4 % 0x50);
    std::__cxx11::to_string((string *)&tmp,index);
    std::operator+(&local_290,"node @ ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp);
    Exception::Exception(pEVar8,Expr_Logic,&local_290);
    __cxa_throw(pEVar8,&Exception::typeinfo,Exception::~Exception);
  }
  Node::Node(&node,pNVar1 + index);
  if (node.type == Operator) {
    pCVar5 = (CustomOperator *)Operator::get_specification(&node.symbol);
    pCVar6 = pCVar5;
    if ((pCVar5 == (CustomOperator *)0x0) &&
       (pCVar6 = Operator::get_custom_specification(&node.symbol), pCVar6 == (CustomOperator *)0x0))
    {
      pEVar8 = (Exception *)__cxa_allocate_exception(0x30);
      std::__cxx11::to_string((string *)&tmp,index);
      std::operator+(&local_2b0,"node @ ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp);
      Exception::Exception(pEVar8,Symbol_Not_Found,&local_2b0);
      __cxa_throw(pEVar8,&Exception::typeinfo,Exception::~Exception);
    }
    (*(pCVar6->super_BaseSpecification)._vptr_BaseSpecification[4])(&positions,pCVar6);
    for (uVar9 = 0; iVar3 = (*(pCVar6->super_BaseSpecification)._vptr_BaseSpecification[3])(pCVar6),
        uVar9 < CONCAT44(extraout_var,iVar3); uVar9 = uVar9 + 1) {
      iVar3 = positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      if ((long)iVar3 < 0) {
        if (direction == 1) {
          pEVar8 = (Exception *)__cxa_allocate_exception(0x30);
          std::__cxx11::to_string((string *)&tmp,index);
          std::operator+(&local_2d0,"node @ ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp);
          Exception::Exception(pEVar8,Expr_Logic,&local_2d0);
          __cxa_throw(pEVar8,&Exception::typeinfo,Exception::~Exception);
        }
        uVar10 = 0;
        uVar11 = 0;
        if ((uint)-iVar3 <= index) {
          this->m_beg = this->m_beg - 1;
          sVar7 = 0xffffffffffffffff;
          goto LAB_0010f987;
        }
LAB_0010f992:
        args[uVar9] = (double)CONCAT44(uVar11,uVar10);
      }
      else if (iVar3 != 0) {
        if (direction == 0xffffffffffffffff) {
          pEVar8 = (Exception *)__cxa_allocate_exception(0x30);
          std::__cxx11::to_string((string *)&tmp,index);
          std::operator+(&local_2f0,"node @ ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp);
          Exception::Exception(pEVar8,Expr_Logic,&local_2f0);
          __cxa_throw(pEVar8,&Exception::typeinfo,Exception::~Exception);
        }
        this->m_end = this->m_end + 1;
        sVar7 = 1;
LAB_0010f987:
        dVar2 = calc(this,(long)iVar3 + index,sVar7);
        uVar10 = SUB84(dVar2,0);
        uVar11 = (undefined4)((ulong)dVar2 >> 0x20);
        goto LAB_0010f992;
      }
    }
    if (pCVar5 == (CustomOperator *)0x0) {
      args_vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      args_vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      args_vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar9 = 0;
          iVar3 = (*(pCVar6->super_BaseSpecification)._vptr_BaseSpecification[3])(pCVar6),
          uVar9 < CONCAT44(extraout_var_00,iVar3); uVar9 = uVar9 + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp);
        std::ostream::_M_insert<double>(args[uVar9]);
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_vec,
                   &local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
      }
      (*(pCVar6->super_BaseSpecification)._vptr_BaseSpecification[5])(local_310,pCVar6,&args_vec);
      (this->m_cache).type = Expression;
      std::__cxx11::string::_M_assign((string *)&(this->m_cache).expression);
      std::__cxx11::string::~string(local_310);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&args_vec);
      local_350 = 0.0;
    }
    else {
      sVar7 = Operator::get_index(&node.symbol);
      local_350 = Operator::trigger(sVar7,args);
      (this->m_cache).type = Empty;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&positions.super__Vector_base<int,_std::allocator<int>_>);
    uVar10 = SUB84(local_350,0);
    uVar11 = (undefined4)((ulong)local_350 >> 0x20);
  }
  else {
    uVar10 = 0;
    uVar11 = 0;
    if (node.type == Number) {
      uVar10 = SUB84(node.number,0);
      uVar11 = (undefined4)((ulong)node.number >> 0x20);
    }
  }
  Node::~Node(&node);
  return (double)CONCAT44(uVar11,uVar10);
}

Assistant:

double NodeList::calc(size_t index, size_t direction){
            if(index >= m_nodes.size()){
                throw Exception(Error::Expr_Logic, "node @ " + std::to_string(index));
            }

            Node node = m_nodes[index];
            bool is_standard_opr = true;

            if(node.type == NodeType::Number){
                return node.number;
            } else if(node.type == NodeType::Operator){
                // std::cout<<"node symbol: "<<node.symbol<<'\n';
                double result = 0.0;
                Operator::BaseSpecification* specification = Operator::get_specification(node.symbol);
                if(!specification){
                    is_standard_opr = false;
                    // printf("standard opr\n");
                    if(!(specification = Operator::get_custom_specification(node.symbol))){
                        // printf("throwing...\n");
                        throw Exception(Error::Symbol_Not_Found, "node @ " + std::to_string(index));
                    }
                }

                auto positions = specification->get_arg_positons();
                double args[10];
                // std::cout<<"index: "<<index<<", list size: "<<size()<<'\n';
                for(size_t i=0; i<specification->get_n_arg(); ++i){
                    if(positions[i] < 0){
                        if(direction == 1){
                            throw Exception(Error::Expr_Logic, "node @ " + std::to_string(index));
                        }

                        if(index >= -positions[i]){
                            m_beg -= 1;
                            args[i] = calc(index+positions[i], -1);
                        } else{
                            args[i] = 0;
                        }
                    } else if(positions[i] > 0){
                        if(direction == -1)
                            throw Exception(Error::Expr_Logic, "node @ " + std::to_string(index));
                        
                        m_end += 1;
                        args[i] = calc(index+positions[i], 1);
                    }
                    // printf("> arg: %lf\n", args[i]);
                }

                if(is_standard_opr){
                    // printf("going with the standart opr...\n");
                    result = Operator::trigger(Operator::get_index(node.symbol), args);
                    m_cache.type = NodeType::Empty;
                } else{
                    std::vector<std::string> args_vec;
                    for(size_t i=0; i<specification->get_n_arg(); ++i){
                        std::ostringstream tmp;
                        tmp<<args[i];
                        args_vec.push_back(tmp.str());
                    }
                    m_cache.set(specification->convert(args_vec));
                    // std::cout<<"cache: "<<m_cache.expression<<'\n';
                }

                return result;
            } else{
                // TO DO
                return 0;
            }
        }